

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_abbrev.c
# Opt level: O3

int dwarf_get_abbrev(Dwarf_Debug dbg,Dwarf_Unsigned offset,Dwarf_Abbrev *returned_abbrev,
                    Dwarf_Unsigned *length,Dwarf_Unsigned *abbr_count,Dwarf_Error *error)

{
  Dwarf_Byte_Ptr abbrev_ptr;
  int iVar1;
  Dwarf_Abbrev space;
  char *msg;
  Dwarf_Signed errval;
  Dwarf_Unsigned utmp;
  Dwarf_Unsigned abbrev_implicit_const_count_out;
  Dwarf_Unsigned labbr_count;
  Dwarf_Byte_Ptr abbrev_ptr_out;
  dwarfstring m;
  Dwarf_Unsigned local_80;
  Dwarf_Byte_Ptr local_78;
  Dwarf_Small *local_70;
  Dwarf_Unsigned local_68;
  Dwarf_Unsigned local_60;
  Dwarf_Byte_Ptr local_58;
  dwarfstring_s local_50;
  
  local_58 = (Dwarf_Small *)0x0;
  local_60 = 0;
  local_80 = 0;
  local_68 = 0;
  if ((dbg == (Dwarf_Debug)0x0) || (dbg->de_magic != 0xebfdebfd)) {
    _dwarf_error_string((Dwarf_Debug)0x0,error,0x51,
                        "DW_DLE_DBG_NULL: dbg argument to dwarf_get_abbrev()either null or it containsa stale Dwarf_Debug pointer"
                       );
    return 1;
  }
  if (((dbg->de_debug_abbrev).dss_data == (Dwarf_Small *)0x0) &&
     (iVar1 = _dwarf_load_debug_info(dbg,error), iVar1 != 0)) {
    return iVar1;
  }
  if ((dbg->de_debug_abbrev).dss_size <= offset) {
    return -1;
  }
  space = (Dwarf_Abbrev)_dwarf_get_alloc(dbg,'\x12',1);
  if (space == (Dwarf_Abbrev)0x0) {
    errval = 0x3e;
  }
  else {
    space->dab_dbg = dbg;
    if (returned_abbrev != (Dwarf_Abbrev *)0x0 && abbr_count != (Dwarf_Unsigned *)0x0) {
      *abbr_count = 0;
      if (length != (Dwarf_Unsigned *)0x0) {
        *length = 1;
      }
      local_70 = (dbg->de_debug_abbrev).dss_data;
      local_78 = local_70 + offset;
      local_70 = local_70 + (dbg->de_debug_abbrev).dss_size;
      iVar1 = _dwarf_leb128_uword_wrapper(dbg,&local_78,local_70,&local_80,error);
      if (iVar1 != 1) {
        space->dab_code = local_80;
        if (local_80 == 0) {
          *returned_abbrev = space;
          *abbr_count = 0;
          if (length != (Dwarf_Unsigned *)0x0) {
            *length = 1;
            return 0;
          }
          return 0;
        }
        iVar1 = _dwarf_leb128_uword_wrapper(dbg,&local_78,local_70,&local_80,error);
        if (iVar1 != 1) {
          if (0xffff < local_80) {
            dwarf_dealloc(dbg,space,0x12);
            iVar1 = _dwarf_format_TAG_err_msg(dbg,local_80,"DW_DLE_TAG_CORRUPT",error);
            return iVar1;
          }
          space->dab_tag = local_80;
          if (local_70 <= local_78) {
            dwarf_dealloc(dbg,space,0x12);
            dwarfstring_constructor(&local_50);
            dwarfstring_append_printf_u
                      (&local_50,
                       "DW_DLE_ABBREV_DECODE_ERROR: Ran off the end of the abbrev section reading tag, starting at abbrev section offset 0x%x"
                       ,offset);
            msg = dwarfstring_string(&local_50);
            _dwarf_error_string(dbg,error,0x6d,msg);
            dwarfstring_destructor(&local_50);
            return 1;
          }
          abbrev_ptr = local_78 + 1;
          space->dab_has_child = *local_78;
          space->dab_abbrev_ptr = abbrev_ptr;
          space->dab_next_ptr = abbrev_ptr;
          space->dab_next_index = 0;
          local_78 = abbrev_ptr;
          iVar1 = _dwarf_count_abbrev_entries
                            (dbg,abbrev_ptr,local_70,&local_60,&local_68,&local_58,error);
          if (iVar1 != 1) {
            local_78 = local_58;
            space->dab_goffset = offset;
            space->dab_count = local_60;
            space->dab_implicit_count = local_68;
            if (local_58 <= local_70) {
              if (length != (Dwarf_Unsigned *)0x0) {
                *length = (long)local_58 - (long)((dbg->de_debug_abbrev).dss_data + offset);
              }
              *returned_abbrev = space;
              *abbr_count = local_60;
              return 0;
            }
            dwarf_dealloc(dbg,space,0x12);
            _dwarf_error_string(dbg,error,0x6d,
                                "DW_DLE_ABBREV_DECODE_ERROR: Ran off the end of the abbrev section reading abbrev_entries."
                               );
            errval = 0x6d;
            goto LAB_001c87fd;
          }
        }
      }
      dwarf_dealloc(dbg,space,0x12);
      return 1;
    }
    dwarf_dealloc(dbg,space,0x12);
    errval = 0x6e;
  }
LAB_001c87fd:
  _dwarf_error(dbg,error,errval);
  return 1;
}

Assistant:

int
dwarf_get_abbrev(Dwarf_Debug dbg,
    Dwarf_Unsigned offset,
    Dwarf_Abbrev * returned_abbrev,
    Dwarf_Unsigned * length,
    Dwarf_Unsigned * abbr_count, Dwarf_Error * error)
{
    Dwarf_Byte_Ptr abbrev_ptr = 0;
    Dwarf_Byte_Ptr abbrev_ptr_out = 0;
    Dwarf_Byte_Ptr abbrev_section_end = 0;
    Dwarf_Abbrev ret_abbrev = 0;
    Dwarf_Unsigned labbr_count = 0;
    Dwarf_Unsigned utmp     = 0;
    Dwarf_Unsigned abbrev_implicit_const_count_out = 0;
    int res = 0;

    CHECK_DBG(dbg,error,"dwarf_get_abbrev()");
    if (dbg->de_debug_abbrev.dss_data == 0) {
        /*  Loads abbrev section (and .debug_info as we do those
            together). */
        res = _dwarf_load_debug_info(dbg, error);
        if (res != DW_DLV_OK) {
            return res;
        }
    }

    if (offset >= dbg->de_debug_abbrev.dss_size) {
        return DW_DLV_NO_ENTRY;
    }
    ret_abbrev = (Dwarf_Abbrev) _dwarf_get_alloc(dbg,
        DW_DLA_ABBREV, 1);
    if (ret_abbrev == NULL) {
        _dwarf_error(dbg, error, DW_DLE_ALLOC_FAIL);
        return DW_DLV_ERROR;
    }
    ret_abbrev->dab_dbg = dbg;
    if (returned_abbrev == 0 || abbr_count == 0) {
        dwarf_dealloc(dbg, ret_abbrev, DW_DLA_ABBREV);
        _dwarf_error(dbg, error, DW_DLE_DWARF_ABBREV_NULL);
        return DW_DLV_ERROR;
    }

    *abbr_count = 0;
    if (length) {
        *length = 1;
    }

    abbrev_ptr = dbg->de_debug_abbrev.dss_data + offset;
    abbrev_section_end =
        dbg->de_debug_abbrev.dss_data + dbg->de_debug_abbrev.dss_size;
    res = _dwarf_leb128_uword_wrapper(dbg,&abbrev_ptr,
        abbrev_section_end,&utmp,error);
    if (res == DW_DLV_ERROR) {
        dwarf_dealloc(dbg, ret_abbrev, DW_DLA_ABBREV);
        return res;
    }
    ret_abbrev->dab_code = utmp;
    if (ret_abbrev->dab_code == 0) {
        *returned_abbrev = ret_abbrev;
        *abbr_count = 0;
        if (length) {
            *length = 1;
        }
        return DW_DLV_OK;
    }

    res = _dwarf_leb128_uword_wrapper(dbg,&abbrev_ptr,
        abbrev_section_end,&utmp,error);
    if (res == DW_DLV_ERROR) {
        dwarf_dealloc(dbg, ret_abbrev, DW_DLA_ABBREV);
        return res;
    }
    if (utmp > DW_TAG_hi_user) {
        dwarf_dealloc(dbg, ret_abbrev, DW_DLA_ABBREV);
        return _dwarf_format_TAG_err_msg(dbg,
            utmp,"DW_DLE_TAG_CORRUPT",
            error);
    }
    ret_abbrev->dab_tag = utmp;
    if (abbrev_ptr >= abbrev_section_end) {
        dwarfstring m;

        dwarf_dealloc(dbg, ret_abbrev, DW_DLA_ABBREV);
        dwarfstring_constructor(&m);
        dwarfstring_append_printf_u(&m,
            "DW_DLE_ABBREV_DECODE_ERROR: Ran off the end "
            "of the abbrev section reading tag, starting at"
            " abbrev section offset 0x%x",offset);
        _dwarf_error_string(dbg, error,
            DW_DLE_ABBREV_DECODE_ERROR,
            dwarfstring_string(&m));
        dwarfstring_destructor(&m);
        return DW_DLV_ERROR;
    }
    ret_abbrev->dab_has_child = *(abbrev_ptr++);
    ret_abbrev->dab_abbrev_ptr = abbrev_ptr;
    ret_abbrev->dab_next_ptr = abbrev_ptr;
    ret_abbrev->dab_next_index = 0;
    res = _dwarf_count_abbrev_entries(dbg,abbrev_ptr,
        abbrev_section_end,&labbr_count,
        &abbrev_implicit_const_count_out,
        &abbrev_ptr_out,error);
    if (res == DW_DLV_ERROR) {
        dwarf_dealloc(dbg, ret_abbrev, DW_DLA_ABBREV);
        return res;
    }
    abbrev_ptr = abbrev_ptr_out;

    /* Global section offset. */
    ret_abbrev->dab_goffset = offset;
    ret_abbrev->dab_count = labbr_count;
    ret_abbrev->dab_implicit_count = abbrev_implicit_const_count_out;
    if (abbrev_ptr > abbrev_section_end) {
        dwarf_dealloc(dbg, ret_abbrev, DW_DLA_ABBREV);
        _dwarf_error_string(dbg, error,
            DW_DLE_ABBREV_DECODE_ERROR,
            "DW_DLE_ABBREV_DECODE_ERROR: Ran off the end "
            "of the abbrev section reading abbrev_entries.");
        _dwarf_error(dbg, error, DW_DLE_ABBREV_DECODE_ERROR);
        return DW_DLV_ERROR;
    }
    if (length) {
        *length = abbrev_ptr - dbg->de_debug_abbrev.dss_data - offset;
    }
    *returned_abbrev = ret_abbrev;
    *abbr_count = labbr_count;
    return DW_DLV_OK;
}